

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O2

void __thiscall Psbt_CreateRecordKey_Test::TestBody(Psbt_CreateRecordKey_Test *this)

{
  char *pcVar1;
  AssertHelper AStack_b8;
  string local_b0;
  AssertionResult gtest_ar;
  ByteData key5;
  ByteData key3;
  ByteData key4;
  ByteData key2;
  ByteData key1;
  
  cfd::core::Psbt::CreateRecordKey(&key1,'\x01');
  std::__cxx11::string::string((string *)&local_b0,"f1f2",(allocator *)&key4);
  cfd::core::ByteData::ByteData(&key3,&local_b0);
  cfd::core::Psbt::CreateRecordKey(&key2,'\x02',&key3);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key3);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_b0,"abc",(allocator *)&key4);
  cfd::core::Psbt::CreateRecordKey(&key3,'\x03',&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_b0,"d1d2",(allocator *)&gtest_ar);
  cfd::core::ByteData::ByteData(&key5,&local_b0);
  cfd::core::Psbt::CreateRecordKey(&key4,'\x04',&key5,'\x05');
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key5);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::string((string *)&local_b0,"def",(allocator *)&gtest_ar);
  cfd::core::Psbt::CreateRecordKey(&key5,'\x05',&local_b0,'\t');
  std::__cxx11::string::~string((string *)&local_b0);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_b0,&key1);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"\"01\"","key1.GetHex().c_str()","01",local_b0._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_b0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x5b3,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_b0,&key2);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"\"0202f1f2\"","key2.GetHex().c_str()","0202f1f2",
             local_b0._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_b0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x5b4,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_b0,&key3);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"\"0303616263\"","key3.GetHex().c_str()","0303616263",
             local_b0._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_b0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x5b5,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_b0,&key4);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"\"0402d1d205\"","key4.GetHex().c_str()","0402d1d205",
             local_b0._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_b0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x5b6,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_b0,&key5);
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"\"050364656609\"","key5.GetHex().c_str()","050364656609",
             local_b0._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_b0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_b0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_psbt.cpp"
               ,0x5b7,pcVar1);
    testing::internal::AssertHelper::operator=(&AStack_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_b8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key5);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key4);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key3);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key2);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key1);
  return;
}

Assistant:

TEST(Psbt, CreateRecordKey) {
  auto key1 = Psbt::CreateRecordKey(1);
  auto key2 = Psbt::CreateRecordKey(2, ByteData("f1f2"));
  auto key3 = Psbt::CreateRecordKey(3, "abc");
  auto key4 = Psbt::CreateRecordKey(4, ByteData("d1d2"), 5);
  auto key5 = Psbt::CreateRecordKey(5, "def", 9);

  EXPECT_STREQ("01", key1.GetHex().c_str());
  EXPECT_STREQ("0202f1f2", key2.GetHex().c_str());
  EXPECT_STREQ("0303616263", key3.GetHex().c_str());
  EXPECT_STREQ("0402d1d205", key4.GetHex().c_str());
  EXPECT_STREQ("050364656609", key5.GetHex().c_str());
}